

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::initPh2ColCost(HModel *this,int firstcol,int lastcol)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  int col;
  long lVar5;
  
  if (firstcol <= lastcol) {
    iVar1 = this->objSense;
    pdVar2 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar3[firstcol + lVar5] = pdVar2[firstcol + lVar5] * (double)iVar1;
      pdVar4[firstcol + lVar5] = 0.0;
      lVar5 = lVar5 + 1;
    } while ((lastcol - firstcol) + 1 != (int)lVar5);
  }
  return;
}

Assistant:

void HModel::initPh2ColCost(int firstcol, int lastcol) {
  // Copy the Phase 2 cost and zero the shift
  for (int col = firstcol; col <= lastcol; col++) {
    int var = col;
    double sense_col_cost = objSense*colCost[col];
    workCost[var] = sense_col_cost;
    workShift[var] = 0.;
  }
}